

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_33ab2::
ARTCorrectnessTest_Node16ConstructWithFFKeyByte_Test<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::~ARTCorrectnessTest_Node16ConstructWithFFKeyByte_Test
          (ARTCorrectnessTest_Node16ConstructWithFFKeyByte_Test<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTCorrectnessTest, Node16ConstructWithFFKeyByte) {
  unodb::test::tree_verifier<TypeParam> verifier;

  verifier.insert_key_range(0xFB, 4);

#ifdef UNODB_DETAIL_WITH_STATS
  verifier.assert_node_counts({4, 1, 0, 0, 0});
#endif  // UNODB_DETAIL_WITH_STATS

  verifier.insert(0xFF, unodb::test::test_values[0]);

  verifier.check_present_values();
  verifier.check_absent_keys({0, 0xFA});

#ifdef UNODB_DETAIL_WITH_STATS
  verifier.assert_node_counts({5, 0, 1, 0, 0});
  verifier.assert_growing_inodes({1, 1, 0, 0});
#endif  // UNODB_DETAIL_WITH_STATS
}